

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

DSPOMDP * __thiscall MyPlanner::InitializeModel(MyPlanner *this,Option *options)

{
  long lVar1;
  NoisyLaserTag *this_00;
  allocator<char> local_39;
  string local_38;
  
  lVar1 = *(long *)(options + 0x70);
  this_00 = (NoisyLaserTag *)operator_new(0x180);
  if (lVar1 == 0) {
    despot::NoisyLaserTag::NoisyLaserTag(this_00);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,*(char **)(options + 0x80),&local_39);
    despot::NoisyLaserTag::NoisyLaserTag(this_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (DSPOMDP *)&(this_00->super_BaseTag).super_BeliefMDP;
}

Assistant:

DSPOMDP* InitializeModel(option::Option* options) {
    DSPOMDP* model = !options[E_PARAMS_FILE] ?
      new NoisyLaserTag() : new NoisyLaserTag(options[E_PARAMS_FILE].arg);
    return model;
  }